

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_qwen3::llm_build_qwen3
          (llm_build_qwen3 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *wo;
  ggml_tensor *act_scales;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *name;
  ggml_tensor *pgVar7;
  const_reference pvVar8;
  ggml_tensor *pgVar9;
  pointer plVar10;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffdc8;
  int iVar11;
  int il_00;
  llm_graph_context *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffde8;
  undefined4 uVar12;
  ggml_tensor *cur_01;
  llm_graph_context *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *pgVar13;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *in_stack_fffffffffffffe88;
  ggml_tensor *in_stack_fffffffffffffe90;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffed8;
  llm_graph_context *in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff98;
  int iVar14;
  llm_graph_context *in_stack_ffffffffffffffc0;
  long lVar15;
  
  lVar15 = in_RDI;
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffde0,
             (llm_graph_params *)in_stack_fffffffffffffdd8);
  pgVar1 = (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (pgVar1 != (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1a5a,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (pgVar1 != (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1a5b,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  pgVar2 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  wo = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffe30);
  act_scales = (ggml_tensor *)
               llm_graph_context::build_attn_inp_kv_unified
                         ((llm_graph_context *)in_stack_fffffffffffffe70);
  for (iVar14 = 0; iVar11 = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
      (long)iVar14 < *(long *)(in_RDI + 0x28); iVar14 = iVar14 + 1) {
    pgVar9 = pgVar2;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)iVar14);
    pgVar3 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                        (int)in_stack_fffffffffffffdd0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)iVar14);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)iVar14);
    pgVar5 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)iVar14);
    pgVar6 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar4,pgVar1,*(undefined8 *)(in_RDI + 0x48),
                    (long)*(int *)(in_RDI + 0xa8));
    ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar5,pgVar1,*(undefined8 *)(in_RDI + 0x50),
                    (long)*(int *)(in_RDI + 0xa8));
    name = (ggml_tensor *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar6,pgVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)iVar14);
    pgVar4 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                        (int)in_stack_fffffffffffffdd0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                  *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                  *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                  *(undefined8 *)(in_RDI + 0xc0),pgVar4,wo,0,*(undefined4 *)(in_RDI + 0x30),
                  *(undefined4 *)(in_RDI + 0xb8));
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)iVar14);
    pgVar4 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                        (int)in_stack_fffffffffffffdd0);
    uVar12 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    pgVar7 = (ggml_tensor *)
             ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                           *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                           *(undefined8 *)(in_RDI + 0xc0),pgVar4,wo,0,*(undefined4 *)(in_RDI + 0x30)
                           ,*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,iVar11);
    pgVar6 = act_scales;
    pgVar13 = in_RCX;
    pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)iVar14);
    type_op = (llm_ffn_op_type)in_RCX;
    type_gate = (llm_ffn_gate_type)pvVar8->wo;
    pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)iVar14);
    iVar11 = (int)pvVar8->bo;
    sqrtf((float)(long)pgVar1);
    cur_01 = (ggml_tensor *)CONCAT44(uVar12,iVar14);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar4 = name;
    pgVar5 = pgVar7;
    pgVar9 = llm_graph_context::build_attn
                       (in_stack_ffffffffffffffc0,(llm_graph_input_attn_kv_unified *)pgVar3,
                        (ggml_cgraph *)pgVar9,wo,pgVar6,
                        (ggml_tensor *)CONCAT44(iVar14,in_stack_ffffffffffffff98),pgVar1,pgVar13,
                        in_RDX,in_RSI,(float)((ulong)pgVar2 >> 0x20),(int)lVar15);
    il_00 = (int)((ulong)pgVar7 >> 0x20);
    in_RCX = pgVar13;
    if ((long)iVar14 == *(long *)(in_RDI + 0x28) + -1) {
      pgVar3 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe20);
      in_stack_fffffffffffffe90 = pgVar3;
      in_stack_fffffffffffffe88 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar9,pgVar3);
      pgVar9 = in_stack_fffffffffffffe88;
      in_stack_fffffffffffffe80 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar2,pgVar3);
      pgVar2 = in_stack_fffffffffffffe80;
      in_RCX = pgVar13;
    }
    pgVar3 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar9,pgVar2);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    pgVar13 = pgVar3;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)iVar14);
    pgVar7 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdf0,cur_01,mw,cur_00,
                        (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)iVar14);
    pgVar2 = pvVar8->ffn_up;
    pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)iVar14);
    pgVar9 = pvVar8->ffn_gate;
    pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)iVar14);
    in_stack_fffffffffffffdd8 = pvVar8->ffn_down;
    in_stack_fffffffffffffdf0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffde8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffde0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdd0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdc8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe60 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar7,pgVar13,in_stack_fffffffffffffe60,
                    (ggml_tensor *)&stack0xfffffffffffffdc8,pgVar9,pgVar2,in_stack_fffffffffffffe80,
                    in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,pgVar4,pgVar5,act_scales,
                    type_op,type_gate,iVar11);
    pgVar2 = in_stack_fffffffffffffe60;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar2,pgVar3);
    in_stack_fffffffffffffe30 =
         llm_graph_context::build_cvec(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,0);
    pgVar2 = in_stack_fffffffffffffe30;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    act_scales = pgVar6;
  }
  pgVar2 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                      in_stack_fffffffffffffdd8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                      (int)in_stack_fffffffffffffdd0);
  pgVar1 = pgVar2;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (char *)in_stack_fffffffffffffdd0,iVar11);
  plVar10 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d05a6);
  plVar10->t_embd = pgVar1;
  pgVar2 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffe30,pgVar2,
                      in_stack_fffffffffffffe20);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (char *)in_stack_fffffffffffffdd0,iVar11);
  pgVar1 = pgVar2;
  plVar10 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d062b);
  plVar10->t_logits = pgVar2;
  ggml_build_forward_expand(in_RCX,pgVar1);
  return;
}

Assistant:

llm_build_qwen3(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = build_norm(Qcur, model.layers[il].attn_q_norm, NULL, LLM_NORM_RMS, il);
                cb(Qcur, "Qcur_normed", il);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = build_norm(Kcur, model.layers[il].attn_k_norm, NULL, LLM_NORM_RMS, il);
                cb(Kcur, "Kcur_normed", il);

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }